

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_if.cc
# Opt level: O2

unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>_>
 __thiscall absl::lts_20240722::time_internal::cctz::TimeZoneIf::Make(TimeZoneIf *this,string *name)

{
  int iVar1;
  undefined1 local_40 [8];
  TimeZoneIf local_38;
  
  iVar1 = std::__cxx11::string::compare((ulong)name,0,(char *)0x5);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffffc8,(ulong)name);
    TimeZoneLibC::Make((TimeZoneLibC *)local_40,(string *)&stack0xffffffffffffffc8);
    this->_vptr_TimeZoneIf = (_func_int **)local_40;
    local_40 = (undefined1  [8])0x0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  else {
    TimeZoneInfo::Make((TimeZoneInfo *)&stack0xffffffffffffffc8,name);
    this->_vptr_TimeZoneIf = (_func_int **)local_38;
  }
  return (__uniq_ptr_data<absl::lts_20240722::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20240722::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneIf> TimeZoneIf::Make(const std::string& name) {
  // Support "libc:localtime" and "libc:*" to access the legacy
  // localtime and UTC support respectively from the C library.
  // NOTE: The "libc:*" zones are internal, test-only interfaces, and
  // are subject to change/removal without notice. Do not use them.
  if (name.compare(0, 5, "libc:") == 0) {
    return TimeZoneLibC::Make(name.substr(5));
  }

  // Otherwise use the "zoneinfo" implementation.
  return TimeZoneInfo::Make(name);
}